

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::TraverseSchema::processElements
          (TraverseSchema *this,DOMElement *elem,ComplexTypeInfo *baseTypeInfo,
          ComplexTypeInfo *newTypeInfo)

{
  ulong uVar1;
  uint key3;
  uint uVar2;
  uint uVar3;
  SchemaInfo *pSVar4;
  XMLSize_t XVar5;
  SchemaGrammar *pSVar6;
  ulong uVar7;
  GrammarResolver *this_00;
  XMLCh *text1;
  MemoryManager *pMVar8;
  XMLSize_t XVar9;
  uint uVar10;
  int iVar11;
  XMLSize_t index;
  SchemaElementDecl *valueToAdopt;
  undefined4 extraout_var;
  Grammar *pGVar12;
  QName *pQVar13;
  undefined4 extraout_var_00;
  BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *this_01;
  undefined4 extraout_var_01;
  long lVar14;
  ulong uVar15;
  XMLSize_t getAt;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_40;
  
  pSVar4 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  local_40.fSchemaInfo = pSVar4;
  if ((baseTypeInfo->fElements != (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0) &&
     (XVar5 = (baseTypeInfo->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).
              fCurCount, XVar5 != 0)) {
    key3 = newTypeInfo->fScopeDefined;
    uVar10 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])();
    getAt = 0;
    do {
      pSVar6 = this->fSchemaGrammar;
      if (&baseTypeInfo->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> ==
          (BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0) {
        valueToAdopt = (SchemaElementDecl *)0x0;
      }
      else {
        valueToAdopt = BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::elementAt
                                 (&baseTypeInfo->fElements->
                                   super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>,getAt);
      }
      uVar2 = valueToAdopt->fEnclosingScope;
      if (uVar2 != 0xfffffffe) {
        pQVar13 = (valueToAdopt->super_XMLElementDecl).fElementName;
        uVar3 = pQVar13->fURIId;
        if (((uVar3 == uVar10) || (uVar3 == this->fTargetNSURI)) ||
           (uVar3 == this->fEmptyNamespaceURI)) {
LAB_003329cc:
          text1 = pQVar13->fLocalPart;
          iVar11 = (*(pSVar6->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])
                             (pSVar6,(ulong)uVar3,text1,0,(ulong)key3);
          lVar14 = CONCAT44(extraout_var_00,iVar11);
          if (lVar14 == 0) {
            valueToAdopt->fEnclosingScope = key3;
            pQVar13 = (valueToAdopt->super_XMLElementDecl).fElementName;
            RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::put
                      (pSVar6->fGroupElemDeclPool,pQVar13->fLocalPart,pQVar13->fURIId,key3,
                       valueToAdopt);
            valueToAdopt->fEnclosingScope = uVar2;
            goto LAB_00332921;
          }
          if ((valueToAdopt->fComplexTypeInfo != *(ComplexTypeInfo **)(lVar14 + 0x50)) ||
             (valueToAdopt->fDatatypeValidator != *(DatatypeValidator **)(lVar14 + 0x78))) {
            reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x43,text1,
                              (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
        else {
          this_00 = this->fGrammarResolver;
          iVar11 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[10])
                             (this->fURIStringPool,(ulong)uVar3);
          pGVar12 = GrammarResolver::getGrammar(this_00,(XMLCh *)CONCAT44(extraout_var,iVar11));
          if ((pGVar12 != (Grammar *)0x0) &&
             (iVar11 = (*(pGVar12->super_XSerializable)._vptr_XSerializable[5])(pGVar12),
             iVar11 == 1)) {
            pQVar13 = (valueToAdopt->super_XMLElementDecl).fElementName;
            goto LAB_003329cc;
          }
        }
        goto LAB_00332ace;
      }
LAB_00332921:
      this_01 = &newTypeInfo->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>;
      if (this_01 == (BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0) {
        this_01 = (BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)
                  XMemory::operator_new(0x30,newTypeInfo->fMemoryManager);
        pMVar8 = newTypeInfo->fMemoryManager;
        ((BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)&this_01->_vptr_BaseRefVectorOf)->
        _vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_00409870;
        this_01->fAdoptedElems = false;
        this_01->fCurCount = 0;
        this_01->fMaxCount = 8;
        this_01->fElemList = (SchemaElementDecl **)0x0;
        this_01->fMemoryManager = pMVar8;
        iVar11 = (*pMVar8->_vptr_MemoryManager[3])(pMVar8,0x40);
        this_01->fElemList = (SchemaElementDecl **)CONCAT44(extraout_var_01,iVar11);
        lVar14 = 0;
        do {
          this_01->fElemList[lVar14] = (SchemaElementDecl *)0x0;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 8);
        ((BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)&this_01->_vptr_BaseRefVectorOf)->
        _vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_004097f8;
        newTypeInfo->fElements = (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)this_01;
LAB_00332aae:
        BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::ensureExtraCapacity(this_01,1);
        XVar9 = this_01->fCurCount;
        this_01->fElemList[XVar9] = valueToAdopt;
        this_01->fCurCount = XVar9 + 1;
      }
      else {
        uVar7 = this_01->fCurCount;
        if (uVar7 == 0) goto LAB_00332aae;
        if (*this_01->fElemList != valueToAdopt) {
          uVar15 = 0;
          do {
            if (uVar7 - 1 == uVar15) goto LAB_00332aae;
            uVar1 = uVar15 + 1;
            lVar14 = uVar15 + 1;
            uVar15 = uVar1;
          } while (this_01->fElemList[lVar14] != valueToAdopt);
          if (uVar7 <= uVar1) goto LAB_00332aae;
        }
      }
LAB_00332ace:
      getAt = getAt + 1;
    } while (getAt != XVar5);
  }
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return;
}

Assistant:

void TraverseSchema::processElements(const DOMElement* const elem,
                                     ComplexTypeInfo* const baseTypeInfo,
                                     ComplexTypeInfo* const newTypeInfo) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    XMLSize_t elemCount = baseTypeInfo->elementCount();

    if (elemCount) {

        int newTypeScope = newTypeInfo->getScopeDefined();
        int schemaURI = fURIStringPool->addOrFind(SchemaSymbols::fgURI_SCHEMAFORSCHEMA);

        for (XMLSize_t i=0; i < elemCount; i++) {

            SchemaGrammar*     aGrammar = fSchemaGrammar;
            SchemaElementDecl* elemDecl = baseTypeInfo->elementAt(i);
            int elemURI = elemDecl->getURI();
            unsigned int elemScope = elemDecl->getEnclosingScope();

            if (elemScope != Grammar::TOP_LEVEL_SCOPE) {

                if (elemURI != fTargetNSURI && elemURI != schemaURI && elemURI != fEmptyNamespaceURI) {
                    Grammar* aGrammar = fGrammarResolver->getGrammar(fURIStringPool->getValueForId(elemURI));

                    if (!aGrammar || aGrammar->getGrammarType() != Grammar::SchemaGrammarType) {
                        continue; // REVISIT - error message
                    }
                }

                const XMLCh*             localPart = elemDecl->getBaseName();
                const SchemaElementDecl* other = (SchemaElementDecl*)
                    aGrammar->getElemDecl(elemURI, localPart, 0, newTypeScope);

                if (other) {

                    if (elemDecl->getComplexTypeInfo() != other->getComplexTypeInfo()
                        || elemDecl->getDatatypeValidator() != other->getDatatypeValidator()) {
                        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateElementDeclaration, localPart);
                    }

                    continue;
                }
                elemDecl->setEnclosingScope(newTypeScope);
                ((SchemaGrammar*) aGrammar)->putGroupElemDecl(elemDecl);
                elemDecl->setEnclosingScope(elemScope);
            }

            newTypeInfo->addElement(elemDecl);
        }
    }
}